

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

enable_if_t<std::is_base_of<interface_type,_Implementation1>::value,_interface_reference> __thiscall
poly::
vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
::emplace_back<Implementation1,int>
          (vector<Interface,std::allocator<Interface>,poly::delegate_cloning_policy<Interface,std::allocator<Interface>,std::integral_constant<bool,true>>>
           *this,int *args)

{
  int iVar1;
  undefined8 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  long v;
  undefined8 *puVar5;
  long v_1;
  long lVar6;
  
  puVar2 = *(undefined8 **)(this + 0x10);
  puVar4 = *(undefined8 **)(this + 0x18);
  if ((puVar2 != puVar4) && (uVar3 = *(ulong *)(this + 0x20), 7 < uVar3)) {
    puVar5 = puVar4;
    if (puVar2 != *(undefined8 **)this) {
      puVar5 = (undefined8 *)(puVar2[-4] + puVar2[-2]);
    }
    if ((long)puVar5 + (uVar3 - ((long)puVar5 + (uVar3 - 1)) % uVar3) + 0xf <= *(ulong *)(this + 8))
    {
      if ((puVar2 == puVar4) || (uVar3 = *(ulong *)(this + 0x20), uVar3 < 8)) {
LAB_0010a464:
        __assert_fail("can_construct_new_elem(s, a)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                      ,0x5a9,
                      "void poly::vector<Interface>::push_back_new_elem(type_tag<T>, Args &&...) [IF = Interface, Allocator = std::allocator<Interface>, CloningPolicy = poly::delegate_cloning_policy<Interface>, T = Implementation1, Args = <int>]"
                     );
      }
      puVar5 = puVar4;
      if (puVar2 != *(undefined8 **)this) {
        puVar5 = (undefined8 *)(puVar2[-4] + puVar2[-2]);
      }
      if (*(ulong *)(this + 8) < (long)puVar5 + (uVar3 - ((long)puVar5 + (uVar3 - 1)) % uVar3) + 0xf
         ) goto LAB_0010a464;
      if (puVar2 != *(undefined8 **)this) {
        puVar4 = (undefined8 *)(puVar2[-4] + puVar2[-2]);
      }
      lVar6 = (uVar3 - 1) - ((uVar3 - 1) + (long)puVar4) % uVar3;
      iVar1 = *args;
      *(undefined ***)((long)puVar4 + lVar6) = &PTR_doYourThing_0010fbf0;
      *(int *)((long)puVar4 + lVar6 + 8) = iVar1;
      *puVar2 = delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
                ::clone_func<Implementation1>;
      puVar2[1] = (long)puVar4 + lVar6;
      puVar2[2] = (long)puVar4 + lVar6;
      puVar2[3] = 0x10;
      puVar2[4] = 8;
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 0x28;
      goto LAB_0010a3ae;
    }
  }
  push_back_new_elem_w_storage_increase<Implementation1,int>(this);
LAB_0010a3ae:
  return *(enable_if_t<std::is_base_of<interface_type,_Implementation1>::value,_interface_reference>
           *)(*(long *)(this + 0x10) + -0x18);
}

Assistant:

inline auto vector<IF, Allocator, CloningPolicy>::emplace_back(Args&&... args)
    -> std::enable_if_t<std::is_base_of<interface_type, T>::value, interface_reference>
{
    constexpr auto s = sizeof(T);
    constexpr auto a = alignof(T);
    if (!can_construct_new_elem(s, a)) {
        push_back_new_elem_w_storage_increase(type_tag<T> {}, std::forward<Args>(args)...);
    } else {
        push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    }
    return back();
}